

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

void uv__write(uv_stream_t *stream)

{
  uint *puVar1;
  uint uVar2;
  undefined1 *puVar3;
  ulong uVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  int iVar11;
  long *plVar12;
  iovec *__iovec;
  msghdr msg;
  anon_union_64_2_d657c519 scratch;
  
LAB_004e5044:
  do {
    if ((stream->io_watcher).fd < 0) {
      __assert_fail("uv__stream_fd(stream) >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x2f4,"void uv__write(uv_stream_t *)");
    }
    puVar3 = (undefined1 *)stream->write_queue[0];
    if (stream->write_queue == (void **)puVar3) {
      return;
    }
    if (*(uv_stream_t **)(puVar3 + -8) != stream) {
      __assert_fail("req->handle == stream",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x2fb,"void uv__write(uv_stream_t *)");
    }
    iVar11 = *(int *)(puVar3 + 0x20) - *(uint *)(puVar3 + 0x10);
    __iovec = (iovec *)((ulong)*(uint *)(puVar3 + 0x10) * 0x10 + *(long *)(puVar3 + 0x18));
    iVar6 = uv__getiovmax();
    if (iVar6 <= iVar11) {
      iVar11 = iVar6;
    }
    if (*(uv_handle_t **)(puVar3 + -0x10) == (uv_handle_t *)0x0) {
      do {
        iVar6 = (stream->io_watcher).fd;
        if (iVar11 == 1) {
          uVar8 = write(iVar6,__iovec->iov_base,__iovec->iov_len);
        }
        else {
          uVar8 = writev(iVar6,__iovec,iVar11);
        }
        if (uVar8 != 0xffffffffffffffff) goto LAB_004e5128;
        piVar9 = __errno_location();
        iVar6 = *piVar9;
      } while (iVar6 == 4);
      uVar8 = 0xffffffffffffffff;
    }
    else {
      uVar7 = uv__handle_fd(*(uv_handle_t **)(puVar3 + -0x10));
      scratch._48_8_ = 0;
      scratch._56_8_ = 0;
      scratch._32_8_ = 0;
      scratch._40_8_ = 0;
      scratch._16_8_ = 0;
      scratch._24_8_ = 0;
      scratch.alias.cmsg_len = 0;
      scratch._8_8_ = 0;
      if ((int)uVar7 < 0) {
        __assert_fail("fd_to_send >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x31b,"void uv__write(uv_stream_t *)");
      }
      msg.msg_name = (void *)0x0;
      msg.msg_namelen = 0;
      msg.msg_iovlen = (size_t)iVar11;
      msg.msg_flags = 0;
      msg.msg_control = &scratch;
      msg.msg_controllen = 0x18;
      scratch._8_8_ = 0x100000001;
      scratch.alias.cmsg_len = 0x14;
      scratch._20_4_ = 0;
      scratch._16_4_ = uVar7;
      msg.msg_iov = (iovec *)__iovec;
      do {
        uVar8 = sendmsg((stream->io_watcher).fd,(msghdr *)&msg,0);
        if (uVar8 != 0xffffffffffffffff) break;
        piVar9 = __errno_location();
      } while (*piVar9 == 4);
LAB_004e5128:
      if (-1 < (long)uVar8) {
        while( true ) {
          if ((long)uVar8 < 0) goto LAB_004e5206;
          uVar7 = *(uint *)(puVar3 + 0x10);
          uVar2 = *(uint *)(puVar3 + 0x20);
          if (uVar2 <= uVar7) {
            __assert_fail("req->write_index < req->nbufs",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                          ,0x36a,"void uv__write(uv_stream_t *)");
          }
          uVar4 = *(ulong *)(*(long *)(puVar3 + 0x18) + 8 + (ulong)uVar7 * 0x10);
          uVar10 = uVar8 - uVar4;
          if (uVar8 < uVar4) break;
          *(uint *)(puVar3 + 0x10) = uVar7 + 1;
          if (stream->write_queue_size < uVar4) {
            __assert_fail("stream->write_queue_size >= len",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                          ,0x385,"void uv__write(uv_stream_t *)");
          }
          stream->write_queue_size = stream->write_queue_size - uVar4;
          uVar8 = uVar10;
          if (uVar7 + 1 == uVar2) {
            if (uVar10 == 0) {
              uv__write_req_finish((uv_write_t *)(puVar3 + -0x58));
              return;
            }
            __assert_fail("n == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                          ,0x38a,"void uv__write(uv_stream_t *)");
          }
        }
        plVar12 = (long *)(*(long *)(puVar3 + 0x18) + (ulong)uVar7 * 0x10);
        *plVar12 = *plVar12 + uVar8;
        plVar12[1] = uVar4 - uVar8;
        stream->write_queue_size = stream->write_queue_size - uVar8;
        cVar5 = (char)stream->flags;
        if (-1 < cVar5) goto LAB_004e5216;
        goto LAB_004e5044;
      }
      piVar9 = __errno_location();
      iVar6 = *piVar9;
    }
    if (iVar6 != 0xb) {
      *(int *)(puVar3 + 0x24) = -iVar6;
      uv__write_req_finish((uv_write_t *)(puVar3 + -0x58));
      uv__io_stop(stream->loop,&stream->io_watcher,4);
      iVar11 = uv__io_active(&stream->io_watcher,1);
      if (iVar11 != 0) {
        return;
      }
      uVar7 = stream->flags;
      if ((uVar7 >> 0xe & 1) == 0) {
        return;
      }
      stream->flags = uVar7 & 0xffffbfff;
      if ((uVar7 >> 0xd & 1) == 0) {
        return;
      }
      puVar1 = &stream->loop->active_handles;
      *puVar1 = *puVar1 - 1;
      return;
    }
    if ((stream->flags & 0x80) == 0) {
LAB_004e5206:
      if (1 < uVar8 + 1) {
        __assert_fail("n == 0 || n == -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x394,"void uv__write(uv_stream_t *)");
      }
      cVar5 = (char)stream->flags;
LAB_004e5216:
      if (-1 < cVar5) {
        uv__io_start(stream->loop,&stream->io_watcher,4);
        return;
      }
      __assert_fail("!(stream->flags & UV_STREAM_BLOCKING)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x397,"void uv__write(uv_stream_t *)");
    }
  } while( true );
}

Assistant:

static void uv__write(uv_stream_t* stream) {
  struct iovec* iov;
  QUEUE* q;
  uv_write_t* req;
  int iovmax;
  int iovcnt;
  ssize_t n;

start:

  assert(uv__stream_fd(stream) >= 0);

  if (QUEUE_EMPTY(&stream->write_queue))
    return;

  q = QUEUE_HEAD(&stream->write_queue);
  req = QUEUE_DATA(q, uv_write_t, queue);
  assert(req->handle == stream);

  /*
   * Cast to iovec. We had to have our own uv_buf_t instead of iovec
   * because Windows's WSABUF is not an iovec.
   */
  assert(sizeof(uv_buf_t) == sizeof(struct iovec));
  iov = (struct iovec*) &(req->bufs[req->write_index]);
  iovcnt = req->nbufs - req->write_index;

  iovmax = uv__getiovmax();

  /* Limit iov count to avoid EINVALs from writev() */
  if (iovcnt > iovmax)
    iovcnt = iovmax;

  /*
   * Now do the actual writev. Note that we've been updating the pointers
   * inside the iov each time we write. So there is no need to offset it.
   */

  if (req->send_handle) {
    struct msghdr msg;
    struct cmsghdr *cmsg;
    int fd_to_send = uv__handle_fd((uv_handle_t*) req->send_handle);
    union {
      char data[64];
      struct cmsghdr alias;
    } scratch;

    memset(&scratch, 0, sizeof(scratch));

    assert(fd_to_send >= 0);

    msg.msg_name = NULL;
    msg.msg_namelen = 0;
    msg.msg_iov = iov;
    msg.msg_iovlen = iovcnt;
    msg.msg_flags = 0;

    msg.msg_control = &scratch.alias;
    msg.msg_controllen = CMSG_SPACE(sizeof(fd_to_send));

    cmsg = CMSG_FIRSTHDR(&msg);
    cmsg->cmsg_level = SOL_SOCKET;
    cmsg->cmsg_type = SCM_RIGHTS;
    cmsg->cmsg_len = CMSG_LEN(sizeof(fd_to_send));

    /* silence aliasing warning */
    {
      void* pv = CMSG_DATA(cmsg);
      int* pi = pv;
      *pi = fd_to_send;
    }

    do {
      n = sendmsg(uv__stream_fd(stream), &msg, 0);
    }
#if defined(__APPLE__)
    /*
     * Due to a possible kernel bug at least in OS X 10.10 "Yosemite",
     * EPROTOTYPE can be returned while trying to write to a socket that is
     * shutting down. If we retry the write, we should get the expected EPIPE
     * instead.
     */
    while (n == -1 && (errno == EINTR || errno == EPROTOTYPE));
#else
    while (n == -1 && errno == EINTR);
#endif
  } else {
    do {
      if (iovcnt == 1) {
        n = write(uv__stream_fd(stream), iov[0].iov_base, iov[0].iov_len);
      } else {
        n = writev(uv__stream_fd(stream), iov, iovcnt);
      }
    }
#if defined(__APPLE__)
    /*
     * Due to a possible kernel bug at least in OS X 10.10 "Yosemite",
     * EPROTOTYPE can be returned while trying to write to a socket that is
     * shutting down. If we retry the write, we should get the expected EPIPE
     * instead.
     */
    while (n == -1 && (errno == EINTR || errno == EPROTOTYPE));
#else
    while (n == -1 && errno == EINTR);
#endif
  }

  if (n < 0) {
    if (errno != EAGAIN && errno != EWOULDBLOCK) {
      /* Error */
      req->error = -errno;
      uv__write_req_finish(req);
      uv__io_stop(stream->loop, &stream->io_watcher, POLLOUT);
      if (!uv__io_active(&stream->io_watcher, POLLIN))
        uv__handle_stop(stream);
      uv__stream_osx_interrupt_select(stream);
      return;
    } else if (stream->flags & UV_STREAM_BLOCKING) {
      /* If this is a blocking stream, try again. */
      goto start;
    }
  } else {
    /* Successful write */

    while (n >= 0) {
      uv_buf_t* buf = &(req->bufs[req->write_index]);
      size_t len = buf->len;

      assert(req->write_index < req->nbufs);

      if ((size_t)n < len) {
        buf->base += n;
        buf->len -= n;
        stream->write_queue_size -= n;
        n = 0;

        /* There is more to write. */
        if (stream->flags & UV_STREAM_BLOCKING) {
          /*
           * If we're blocking then we should not be enabling the write
           * watcher - instead we need to try again.
           */
          goto start;
        } else {
          /* Break loop and ensure the watcher is pending. */
          break;
        }

      } else {
        /* Finished writing the buf at index req->write_index. */
        req->write_index++;

        assert((size_t)n >= len);
        n -= len;

        assert(stream->write_queue_size >= len);
        stream->write_queue_size -= len;

        if (req->write_index == req->nbufs) {
          /* Then we're done! */
          assert(n == 0);
          uv__write_req_finish(req);
          /* TODO: start trying to write the next request. */
          return;
        }
      }
    }
  }

  /* Either we've counted n down to zero or we've got EAGAIN. */
  assert(n == 0 || n == -1);

  /* Only non-blocking streams should use the write_watcher. */
  assert(!(stream->flags & UV_STREAM_BLOCKING));

  /* We're not done. */
  uv__io_start(stream->loop, &stream->io_watcher, POLLOUT);

  /* Notify select() thread about state change */
  uv__stream_osx_interrupt_select(stream);
}